

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arm.cpp
# Opt level: O0

bool ArmGetRlist(char *source,int *RetLen,int ValidRegisters,int *Result)

{
  int iVar1;
  int local_44;
  int i;
  int num2;
  int num;
  int list;
  int len;
  int *Result_local;
  int ValidRegisters_local;
  int *RetLen_local;
  char *source_local;
  
  num = 0;
  num2 = 0;
  do {
    local_44 = ArmGetRegister(source + num,RetLen);
    if (local_44 == -1) {
      return false;
    }
    num = *RetLen + num;
    if (source[num] == '-') {
      iVar1 = ArmGetRegister(source + (num + 1),RetLen);
      if ((iVar1 == -1) || (iVar1 < local_44)) {
        return false;
      }
      num = *RetLen + 1 + num;
      for (; local_44 <= iVar1; local_44 = local_44 + 1) {
        if ((ValidRegisters & 1 << ((byte)local_44 & 0x1f)) == 0) {
          return false;
        }
        num2 = 1 << ((byte)local_44 & 0x1f) | num2;
      }
    }
    else {
      if ((ValidRegisters & 1 << ((byte)local_44 & 0x1f)) == 0) {
        return false;
      }
      num2 = 1 << ((byte)local_44 & 0x1f) | num2;
    }
    if (source[num] != ',') {
      *RetLen = num;
      *Result = num2;
      return true;
    }
    num = num + 1;
  } while( true );
}

Assistant:

bool ArmGetRlist(char* source, int& RetLen, int ValidRegisters, int& Result)
{
	int len = 0;

	int list = 0;
	while (true)
	{
		int num = ArmGetRegister(&source[len],RetLen);
		if (num == -1) return false;
		len += RetLen;

		if (source[len] == '-')
		{
			int num2 = ArmGetRegister(&source[len+1],RetLen);
			if (num2 == -1 || num2 < num) return false;
			len += (RetLen+1);
			for (int i = num; i <= num2; i++)
			{
				if ((ValidRegisters & (1 << i)) == 0) return false;
				list |= (1 << i);
			}
		} else {
			if ((ValidRegisters & (1 << num)) == 0) return false;
			list |= (1 << num);
		}
		if (source[len] != ',') break;
		len++;
	}

	RetLen = len;
	Result = list;
	return true;
}